

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_ddot(int n,double *x,int incx,double *y,int incy,double *alpha)

{
  int local_3c;
  int i;
  double *alpha_local;
  int incy_local;
  double *y_local;
  int incx_local;
  double *x_local;
  int n_local;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x6f,"void la_ddot(int, double *, int, double *, int, double *)");
  }
  if (y != (double *)0x0) {
    *alpha = 0.0;
    for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
      *alpha = x[local_3c * incx] * y[local_3c * incy] + *alpha;
    }
    return;
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x70,"void la_ddot(int, double *, int, double *, int, double *)");
}

Assistant:

void la_ddot(
        int n,
        double *x, int incx,
        double *y, int incy,
        double *alpha)
{
    assert(x);
    assert(y);

    *alpha = 0.0;
    for (int i = 0; i < n; i++) {
        *alpha += x[i * incx] * y[i * incy];
    }
}